

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O0

OutputFile * __thiscall re2c::OutputFile::wraw(OutputFile *this,char *s,size_t n)

{
  ostream *poVar1;
  size_t n_local;
  char *s_local;
  OutputFile *this_local;
  
  poVar1 = stream(this);
  std::ostream::write((char *)poVar1,(long)s);
  return this;
}

Assistant:

OutputFile & OutputFile::wraw (const char * s, size_t n)
{
	stream ().write (s, static_cast<std::streamsize> (n));
	return *this;
}